

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall CP::vector<int>::resize(vector<int> *this,size_t n)

{
  int *piVar1;
  size_t i;
  ulong uVar2;
  
  if (this->mCap < n) {
    expand(this,n);
  }
  uVar2 = this->mSize;
  if (uVar2 < n) {
    piVar1 = this->mData;
    for (; uVar2 < n; uVar2 = uVar2 + 1) {
      piVar1[uVar2] = 0;
    }
  }
  this->mSize = n;
  return;
}

Assistant:

void resize(size_t n) {
      if (n > mCap)
        expand(n);

      if (n > mSize) {
        T init = T();
        for (size_t i = mSize;i < n;i++) 
          mData[i] = init;
      }


      mSize = n;
    }